

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugTextUnformattedWithLocateItem(char *line_begin,char *line_end)

{
  char *text_end;
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  char *text_end_00;
  ImVec2 *r_max;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImGuiID id;
  char *local_78;
  ImVec2 *local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ImVec2 local_48;
  undefined8 uStack_40;
  
  local_78 = line_begin;
  TextUnformatted(line_begin,line_end);
  bVar4 = IsItemHovered(0);
  if (bVar4) {
    local_70 = &(GImGui->LastItemData).Rect.Min;
    local_48 = (GImGui->LastItemData).Rect.Min;
    uStack_40 = 0;
    r_max = &(GImGui->LastItemData).Rect.Max;
    local_58 = ZEXT416((uint)(local_48.y + 0.0));
    for (text_end_00 = local_78; text_end_00 <= line_end + -10; text_end_00 = text_end_00 + 1) {
      id = 0;
      if ((((*text_end_00 == '0') && ((byte)(text_end_00[1] | 0x20U) == 0x78)) &&
          (iVar5 = __isoc99_sscanf(text_end_00 + 2,"%X",&id), iVar5 == 1)) &&
         ((9 < (byte)(text_end_00[10] - 0x30U) &&
          ((uVar6 = (byte)text_end_00[10] - 0x41, 0x25 < uVar6 ||
           ((0x3f0000003fU >> ((ulong)uVar6 & 0x3f) & 1) == 0)))))) {
        text_end = text_end_00 + 10;
        IVar1 = CalcTextSize(local_78,text_end_00,false,-1.0);
        local_68._8_4_ = extraout_XMM0_Dc;
        local_68._0_4_ = IVar1.x;
        local_68._4_4_ = IVar1.y;
        local_68._12_4_ = extraout_XMM0_Dd;
        IVar2 = CalcTextSize(text_end_00,text_end,false,-1.0);
        IVar3.y = (float)local_58._0_4_;
        IVar3.x = local_48.x + (float)local_68._0_4_;
        *local_70 = IVar3;
        IVar1.y = IVar2.y + local_48.y;
        IVar1.x = (float)local_68._0_4_ + IVar2.x + local_48.x;
        *r_max = IVar1;
        bVar4 = IsMouseHoveringRect(local_70,r_max,true);
        text_end_00 = text_end;
        if (bVar4) {
          DebugLocateItemOnHover(id);
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::DebugTextUnformattedWithLocateItem(const char* line_begin, const char* line_end)
{
    TextUnformatted(line_begin, line_end);
    if (!IsItemHovered())
        return;
    ImGuiContext& g = *GImGui;
    ImRect text_rect = g.LastItemData.Rect;
    for (const char* p = line_begin; p <= line_end - 10; p++)
    {
        ImGuiID id = 0;
        if (p[0] != '0' || (p[1] != 'x' && p[1] != 'X') || sscanf(p + 2, "%X", &id) != 1 || ImCharIsXdigitA(p[10]))
            continue;
        ImVec2 p0 = CalcTextSize(line_begin, p);
        ImVec2 p1 = CalcTextSize(p, p + 10);
        g.LastItemData.Rect = ImRect(text_rect.Min + ImVec2(p0.x, 0.0f), text_rect.Min + ImVec2(p0.x + p1.x, p1.y));
        if (IsMouseHoveringRect(g.LastItemData.Rect.Min, g.LastItemData.Rect.Max, true))
            DebugLocateItemOnHover(id);
        p += 10;
    }
}